

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O3

OperatorFinalizeResultType __thiscall
duckdb::CachingPhysicalOperator::FinalExecute
          (CachingPhysicalOperator *this,ExecutionContext *context,DataChunk *chunk,
          GlobalOperatorState *gstate,OperatorState *state_p)

{
  type chunk_00;
  
  if (state_p[1]._vptr_OperatorState == (_func_int **)0x0) {
    chunk->count = 0;
  }
  else {
    chunk_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                          *)(state_p + 1));
    DataChunk::Move(chunk,chunk_00);
    ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::reset
              ((__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
               (state_p + 1),(pointer)0x0);
  }
  return FINISHED;
}

Assistant:

OperatorFinalizeResultType CachingPhysicalOperator::FinalExecute(ExecutionContext &context, DataChunk &chunk,
                                                                 GlobalOperatorState &gstate,
                                                                 OperatorState &state_p) const {
	auto &state = state_p.Cast<CachingOperatorState>();
	if (state.cached_chunk) {
		chunk.Move(*state.cached_chunk);
		state.cached_chunk.reset();
	} else {
		chunk.SetCardinality(0);
	}
	return OperatorFinalizeResultType::FINISHED;
}